

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBuffer
          (StringRef InputData,StringRef BufferName,bool RequiresNullTerminator)

{
  StringRef InputData_00;
  pointer __p;
  undefined7 in_register_00000081;
  byte in_R9B;
  Twine local_60;
  NamedBufferAlloc local_48;
  pointer local_40;
  MemoryBufferMem<llvm::MemoryBuffer> *Ret;
  undefined1 auStack_30 [7];
  bool RequiresNullTerminator_local;
  StringRef BufferName_local;
  StringRef InputData_local;
  
  BufferName_local.Length = InputData.Length;
  _auStack_30 = (char *)BufferName.Length;
  BufferName_local.Data = (char *)CONCAT71(in_register_00000081,RequiresNullTerminator);
  Ret._7_1_ = in_R9B & 1;
  Twine::Twine(&local_60,(StringRef *)auStack_30);
  anon_unknown.dwarf_36755e5::NamedBufferAlloc::NamedBufferAlloc(&local_48,&local_60);
  __p = (pointer)operator_new(0x18,&local_48);
  InputData_00.Length = (size_t)BufferName.Data;
  InputData_00.Data = (char *)BufferName_local.Length;
  anon_unknown.dwarf_36755e5::MemoryBufferMem<llvm::MemoryBuffer>::MemoryBufferMem
            ((MemoryBufferMem<llvm::MemoryBuffer> *)__p,InputData_00,(bool)(Ret._7_1_ & 1));
  local_40 = __p;
  std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>::
  unique_ptr<std::default_delete<llvm::MemoryBuffer>,void>
            ((unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>> *)
             InputData.Data,__p);
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBuffer(StringRef InputData, StringRef BufferName,
                           bool RequiresNullTerminator) {
  auto *Ret = new (NamedBufferAlloc(BufferName))
      MemoryBufferMem<MemoryBuffer>(InputData, RequiresNullTerminator);
  return std::unique_ptr<MemoryBuffer>(Ret);
}